

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfobjs.c
# Opt level: O2

FT_Error tt_face_get_name(TT_Face face,FT_UShort nameid,FT_String **name)

{
  FT_Memory memory;
  TT_NameRec *pTVar1;
  FT_Stream stream;
  ulong uVar2;
  ulong uVar3;
  FT_String *pFVar4;
  FT_Byte *buffer;
  long lVar5;
  code *pcVar6;
  FT_UShort *pFVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  bool bVar11;
  FT_Error error;
  FT_String **local_38;
  
  memory = (face->root).memory;
  error = 0;
  pTVar1 = (face->name_table).names;
  pFVar7 = &pTVar1->stringLength;
  uVar2 = 0xffffffffffffffff;
  uVar10 = 0xffffffff;
  uVar9 = 0xffffffff;
  uVar3 = 0xffffffff;
  bVar11 = false;
  for (uVar8 = 0; face->num_names != uVar8; uVar8 = uVar8 + 1) {
    if ((pFVar7[-1] == nameid) && (*pFVar7 != 0)) {
      switch(((TT_NameRec *)(pFVar7 + -4))->platformID) {
      case 0:
      case 2:
        uVar3 = (ulong)uVar8;
        break;
      case 1:
        if (pFVar7[-2] == 0) {
          uVar10 = (ulong)uVar8;
        }
        else {
          uVar2 = uVar2 & 0xffffffff;
          if (pFVar7[-3] == 0) {
            uVar2 = (ulong)uVar8;
          }
        }
        break;
      case 3:
        if (((((int)uVar9 == -1) || ((pFVar7[-2] & 0x3ff) == 9)) && (pFVar7[-3] < 0xb)) &&
           ((0x403U >> (pFVar7[-3] & 0x1f) & 1) != 0)) {
          bVar11 = (pFVar7[-2] & 0x3ff) == 9;
          uVar9 = (ulong)uVar8;
        }
      }
    }
    pFVar7 = pFVar7 + 0x10;
  }
  uVar2 = uVar2 & 0xffffffff;
  if (-1 < (int)uVar10) {
    uVar2 = uVar10;
  }
  local_38 = name;
  if ((int)uVar9 < 0) {
    if (-1 < (int)uVar2) goto LAB_0020a39e;
    if (-1 < (int)uVar3) {
      pcVar6 = tt_name_ascii_from_utf16;
      goto LAB_0020a3a5;
    }
  }
  else {
    if (((int)uVar2 < 0) || (bVar11)) {
      lVar5 = uVar9 * 0x20;
      pFVar4 = (FT_String *)0x0;
      if ((10 < pTVar1[uVar9].encodingID) ||
         ((0x403U >> (pTVar1[uVar9].encodingID & 0x1f) & 1) == 0)) goto LAB_0020a440;
      pcVar6 = tt_name_ascii_from_utf16;
    }
    else {
LAB_0020a39e:
      pcVar6 = tt_name_ascii_from_other;
      uVar3 = uVar2;
LAB_0020a3a5:
      if (pTVar1 == (TT_NameRec *)0x0) goto LAB_0020a43e;
      lVar5 = uVar3 << 5;
    }
    lVar5 = (long)&pTVar1->platformID + lVar5;
    if (*(long *)(lVar5 + 0x18) != 0) {
LAB_0020a3be:
      pFVar4 = (FT_String *)(*pcVar6)(lVar5,memory);
      goto LAB_0020a440;
    }
    stream = (face->name_table).stream;
    buffer = (FT_Byte *)ft_mem_qrealloc(memory,1,0,(ulong)*(ushort *)(lVar5 + 8),(void *)0x0,&error)
    ;
    *(FT_Byte **)(lVar5 + 0x18) = buffer;
    if (error == 0) {
      error = FT_Stream_Seek(stream,*(FT_ULong *)(lVar5 + 0x10));
      buffer = *(FT_Byte **)(lVar5 + 0x18);
      if (error == 0) {
        error = FT_Stream_Read(stream,buffer,(ulong)*(ushort *)(lVar5 + 8));
        if (error == 0) goto LAB_0020a3be;
        buffer = *(FT_Byte **)(lVar5 + 0x18);
      }
    }
    ft_mem_free(memory,buffer);
    *(undefined8 *)(lVar5 + 0x18) = 0;
    *(undefined2 *)(lVar5 + 8) = 0;
  }
LAB_0020a43e:
  pFVar4 = (FT_String *)0x0;
LAB_0020a440:
  *local_38 = pFVar4;
  return error;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  tt_face_get_name( TT_Face      face,
                    FT_UShort    nameid,
                    FT_String**  name )
  {
    FT_Memory   memory = face->root.memory;
    FT_Error    error  = FT_Err_Ok;
    FT_String*  result = NULL;
    FT_UShort   n;
    TT_Name     rec;

    FT_Int  found_apple         = -1;
    FT_Int  found_apple_roman   = -1;
    FT_Int  found_apple_english = -1;
    FT_Int  found_win           = -1;
    FT_Int  found_unicode       = -1;

    FT_Bool  is_english = 0;

    TT_Name_ConvertFunc  convert;


    FT_ASSERT( name );

    rec = face->name_table.names;
    for ( n = 0; n < face->num_names; n++, rec++ )
    {
      /* According to the OpenType 1.3 specification, only Microsoft or  */
      /* Apple platform IDs might be used in the `name' table.  The      */
      /* `Unicode' platform is reserved for the `cmap' table, and the    */
      /* `ISO' one is deprecated.                                        */
      /*                                                                 */
      /* However, the Apple TrueType specification doesn't say the same  */
      /* thing and goes to suggest that all Unicode `name' table entries */
      /* should be coded in UTF-16 (in big-endian format I suppose).     */
      /*                                                                 */
      if ( rec->nameID == nameid && rec->stringLength > 0 )
      {
        switch ( rec->platformID )
        {
        case TT_PLATFORM_APPLE_UNICODE:
        case TT_PLATFORM_ISO:
          /* there is `languageID' to check there.  We should use this */
          /* field only as a last solution when nothing else is        */
          /* available.                                                */
          /*                                                           */
          found_unicode = n;
          break;

        case TT_PLATFORM_MACINTOSH:
          /* This is a bit special because some fonts will use either    */
          /* an English language id, or a Roman encoding id, to indicate */
          /* the English version of its font name.                       */
          /*                                                             */
          if ( rec->languageID == TT_MAC_LANGID_ENGLISH )
            found_apple_english = n;
          else if ( rec->encodingID == TT_MAC_ID_ROMAN )
            found_apple_roman = n;
          break;

        case TT_PLATFORM_MICROSOFT:
          /* we only take a non-English name when there is nothing */
          /* else available in the font                            */
          /*                                                       */
          if ( found_win == -1 || ( rec->languageID & 0x3FF ) == 0x009 )
          {
            switch ( rec->encodingID )
            {
            case TT_MS_ID_SYMBOL_CS:
            case TT_MS_ID_UNICODE_CS:
            case TT_MS_ID_UCS_4:
              is_english = FT_BOOL( ( rec->languageID & 0x3FF ) == 0x009 );
              found_win  = n;
              break;

            default:
              ;
            }
          }
          break;

        default:
          ;
        }
      }
    }

    found_apple = found_apple_roman;
    if ( found_apple_english >= 0 )
      found_apple = found_apple_english;

    /* some fonts contain invalid Unicode or Macintosh formatted entries; */
    /* we will thus favor names encoded in Windows formats if available   */
    /* (provided it is an English name)                                   */
    /*                                                                    */
    convert = NULL;
    if ( found_win >= 0 && !( found_apple >= 0 && !is_english ) )
    {
      rec = face->name_table.names + found_win;
      switch ( rec->encodingID )
      {
        /* all Unicode strings are encoded using UTF-16BE */
      case TT_MS_ID_UNICODE_CS:
      case TT_MS_ID_SYMBOL_CS:
        convert = tt_name_ascii_from_utf16;
        break;

      case TT_MS_ID_UCS_4:
        /* Apparently, if this value is found in a name table entry, it is */
        /* documented as `full Unicode repertoire'.  Experience with the   */
        /* MsGothic font shipped with Windows Vista shows that this really */
        /* means UTF-16 encoded names (UCS-4 values are only used within   */
        /* charmaps).                                                      */
        convert = tt_name_ascii_from_utf16;
        break;

      default:
        ;
      }
    }
    else if ( found_apple >= 0 )
    {
      rec     = face->name_table.names + found_apple;
      convert = tt_name_ascii_from_other;
    }
    else if ( found_unicode >= 0 )
    {
      rec     = face->name_table.names + found_unicode;
      convert = tt_name_ascii_from_utf16;
    }

    if ( rec && convert )
    {
      if ( !rec->string )
      {
        FT_Stream  stream = face->name_table.stream;


        if ( FT_QNEW_ARRAY ( rec->string, rec->stringLength ) ||
             FT_STREAM_SEEK( rec->stringOffset )              ||
             FT_STREAM_READ( rec->string, rec->stringLength ) )
        {
          FT_FREE( rec->string );
          rec->stringLength = 0;
          result            = NULL;
          goto Exit;
        }
      }

      result = convert( rec, memory );
    }

  Exit:
    *name = result;
    return error;
  }